

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_mfiles.c
# Opt level: O3

multi_files *
AddMultiFiles(char *file_name,char *type_name,char *show_filename,multi_files **multi_first,
             multi_files **multi_last)

{
  multi_files *pmVar1;
  multi_files *pmVar2;
  multi_files **ppmVar3;
  
  pmVar1 = (multi_files *)calloc(1,0x18);
  if (pmVar1 == (multi_files *)0x0) {
    pmVar1 = *multi_first;
    while (pmVar1 != (multi_files *)0x0) {
      pmVar2 = pmVar1->next;
      free(pmVar1);
      pmVar1 = pmVar2;
    }
    *multi_first = (multi_files *)0x0;
    pmVar1 = (multi_files *)0x0;
    if (multi_last == (multi_files **)0x0) {
      return (multi_files *)0x0;
    }
    goto LAB_0010cb4c;
  }
  (pmVar1->form).option = CURLFORM_FILE;
  (pmVar1->form).value = file_name;
  ppmVar3 = &(*multi_last)->next;
  if (*multi_last == (multi_files *)0x0) {
    ppmVar3 = multi_first;
  }
  *ppmVar3 = pmVar1;
  *multi_last = pmVar1;
  pmVar2 = pmVar1;
  if (type_name == (char *)0x0) {
LAB_0010cab4:
    if (show_filename == (char *)0x0) {
      return pmVar2;
    }
    pmVar1 = (multi_files *)calloc(1,0x18);
    if (pmVar1 != (multi_files *)0x0) {
      (pmVar1->form).option = CURLFORM_FILENAME;
      (pmVar1->form).value = show_filename;
      pmVar2->next = pmVar1;
      goto LAB_0010cb4c;
    }
    pmVar1 = *multi_first;
    while (pmVar1 != (multi_files *)0x0) {
      pmVar2 = pmVar1->next;
      free(pmVar1);
      pmVar1 = pmVar2;
    }
  }
  else {
    pmVar2 = (multi_files *)calloc(1,0x18);
    if (pmVar2 != (multi_files *)0x0) {
      (pmVar2->form).option = CURLFORM_CONTENTTYPE;
      (pmVar2->form).value = type_name;
      pmVar1->next = pmVar2;
      *multi_last = pmVar2;
      goto LAB_0010cab4;
    }
    pmVar1 = *multi_first;
    while (pmVar1 != (multi_files *)0x0) {
      pmVar2 = pmVar1->next;
      free(pmVar1);
      pmVar1 = pmVar2;
    }
  }
  *multi_first = (multi_files *)0x0;
  pmVar1 = (multi_files *)0x0;
LAB_0010cb4c:
  *multi_last = pmVar1;
  return pmVar1;
}

Assistant:

struct multi_files *AddMultiFiles(const char *file_name,
                                  const char *type_name,
                                  const char *show_filename,
                                  struct multi_files **multi_first,
                                  struct multi_files **multi_last)
{
  struct multi_files *multi;
  struct multi_files *multi_type;
  struct multi_files *multi_name;

  multi = calloc(1, sizeof(struct multi_files));
  if(multi) {
    multi->form.option = CURLFORM_FILE;
    multi->form.value = file_name;
    AppendNode(multi_first, multi_last, multi);
  }
  else {
    FreeMultiInfo(multi_first, multi_last);
    return NULL;
  }

  if(type_name) {
    multi_type = calloc(1, sizeof(struct multi_files));
    if(multi_type) {
      multi_type->form.option = CURLFORM_CONTENTTYPE;
      multi_type->form.value = type_name;
      AppendNode(multi_first, multi_last, multi_type);
    }
    else {
      FreeMultiInfo(multi_first, multi_last);
      return NULL;
    }
  }

  if(show_filename) {
    multi_name = calloc(1, sizeof(struct multi_files));
    if(multi_name) {
      multi_name->form.option = CURLFORM_FILENAME;
      multi_name->form.value = show_filename;
      AppendNode(multi_first, multi_last, multi_name);
    }
    else {
      FreeMultiInfo(multi_first, multi_last);
      return NULL;
    }
  }

  return *multi_last;
}